

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::ZoneBitVector::copyFrom
          (ZoneBitVector *this,ZoneAllocator *allocator,ZoneBitVector *other)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sbyte sVar3;
  Error EVar4;
  ZoneBitVector *pZVar5;
  ZoneBitVector *extraout_RAX;
  ZoneBitVector *pZVar6;
  sbyte sVar7;
  ulong in_RCX;
  ulong uVar8;
  uint extraout_EDX;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ZoneAllocator *pZVar14;
  ZoneAllocator *size;
  ulong uVar15;
  ulong in_R8;
  long lVar16;
  ZoneAllocator *pZVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  size_t allocatedCapacity;
  uint uStack_ac;
  ulong uStack_a8;
  ZoneAllocator *pZStack_a0;
  ZoneAllocator *pZStack_98;
  ulong uStack_90;
  ZoneBitVector *pZStack_88;
  ZoneAllocator *pZStack_80;
  ulong uStack_78;
  ZoneBitVector *pZStack_70;
  ZoneBitVector *pZStack_68;
  ulong uStack_60;
  ZoneBitVector *local_50;
  ZoneAllocator *local_48;
  ZoneBitVector *local_40;
  ulong local_38;
  
  uVar11 = *(uint *)(other + 8);
  pZVar17 = (ZoneAllocator *)(ulong)uVar11;
  if (uVar11 == 0) {
    *(undefined4 *)(this + 8) = 0;
    return 0;
  }
  pZVar6 = *(ZoneBitVector **)this;
  uVar13 = uVar11 + 0x3f;
  uVar8 = (ulong)uVar13;
  pZVar5 = pZVar6;
  if (uVar11 <= *(uint *)(this + 0xc)) goto LAB_0012b262;
  uVar10 = uVar13 & 0xffffffc0;
  if (uVar10 < uVar11) {
    return 1;
  }
  local_40 = other;
  if (*(long *)allocator == 0) {
    uStack_60 = 0x12b2d5;
    allocator = (ZoneAllocator *)this;
    copyFrom();
    pZVar5 = extraout_RAX;
    local_38 = in_RCX;
LAB_0012b2d5:
    uVar12 = (ulong)uVar10;
  }
  else {
    uStack_60 = 0x12b22e;
    local_48 = allocator;
    pZVar5 = (ZoneBitVector *)ZoneAllocator::_alloc(allocator,(ulong)(uVar10 >> 3),&local_38);
    if (pZVar5 == (ZoneBitVector *)0x0) {
      return 1;
    }
    uVar12 = local_38 * 8;
    if (uVar12 < local_38) goto LAB_0012b2d5;
  }
  other = local_40;
  uVar10 = (uint)local_38;
  if (pZVar6 == (ZoneBitVector *)0x0) {
LAB_0012b258:
    *(ZoneBitVector **)this = pZVar5;
    *(int *)(this + 0xc) = (int)uVar12;
LAB_0012b262:
    *(uint *)(this + 8) = uVar11;
    if (0x3f < uVar13) {
      lVar9 = *(long *)other;
      uVar8 = 0;
      do {
        *(undefined8 *)(pZVar5 + uVar8 * 8) = *(undefined8 *)(lVar9 + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar13 >> 6 != uVar8);
    }
    return 0;
  }
  pZVar14 = local_48;
  if (*(long *)local_48 == 0) {
    uStack_60 = 0x12b2e2;
    copyFrom();
  }
  else {
    allocator = (ZoneAllocator *)(ulong)*(uint *)(this + 0xc);
    local_50 = pZVar5;
    if (7 < *(uint *)(this + 0xc)) {
      uStack_60 = 0x12b2c9;
      copyFrom();
      pZVar5 = local_50;
      goto LAB_0012b258;
    }
  }
  uStack_60 = 0x12b2e7;
  copyFrom();
  pZStack_88 = other;
  pZStack_80 = pZVar17;
  uStack_78 = uVar12;
  pZStack_70 = pZVar6;
  pZStack_68 = this;
  uStack_60 = uVar8;
  if (uVar10 < extraout_EDX) {
    _resize();
    size = pZVar14;
    allocator = pZVar17;
    pZVar5 = this;
LAB_0012b58c:
    uVar11 = (uint)other;
    _resize();
LAB_0012b591:
    uVar12 = (ulong)uVar13;
LAB_0012b38e:
    if (0x3f < uVar11 + 0x3f) {
      uVar8 = 0;
      do {
        *(undefined8 *)(pZVar6 + uVar8 * 8) = *(undefined8 *)(pZVar5 + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar11 + 0x3f >> 6 != uVar8);
LAB_0012b3c7:
      if (*(long *)pZStack_a0 == 0) {
        _resize();
      }
      else {
        uVar13 = *(uint *)(allocator + 0xc);
        if (7 < uVar13) {
          uVar8 = (ulong)(uVar13 >> 3);
          if (uVar13 < 0x1008) {
            if (uVar13 < 0x408) {
              uVar8 = uVar8 + 0x1fffffffff >> 5;
            }
            else {
              uVar8 = (uVar8 + 0x3fffffff7f >> 6) + 4;
            }
            *(undefined8 *)pZVar5 = *(undefined8 *)(pZStack_a0 + (uVar8 & 0xffffffff) * 8 + 8);
            *(ZoneBitVector **)(pZStack_a0 + (uVar8 & 0xffffffff) * 8 + 8) = pZVar5;
          }
          else {
            ZoneAllocator::_releaseDynamic(pZStack_a0,pZVar5,uVar8);
          }
          goto LAB_0012b438;
        }
      }
      _resize();
      goto LAB_0012b5a3;
    }
    if (pZVar5 != (ZoneBitVector *)0x0) goto LAB_0012b3c7;
LAB_0012b438:
    *(ZoneBitVector **)allocator = pZVar6;
    *(int *)(allocator + 0xc) = (int)uVar12;
    in_R8 = (ulong)uStack_ac;
    size = pZStack_98;
    uVar8 = uStack_a8;
    pZVar5 = pZVar6;
  }
  else {
    uVar8 = (ulong)extraout_EDX;
    pZStack_98 = allocator + 8;
    uVar11 = *(uint *)(allocator + 8);
    other = (ZoneBitVector *)(ulong)uVar11;
    if (extraout_EDX <= uVar11) {
      _resize();
      return 0;
    }
    pZVar5 = *(ZoneBitVector **)allocator;
    size = pZStack_98;
    if (*(uint *)(allocator + 0xc) < extraout_EDX) {
      uStack_ac = (uint)in_R8;
      uVar13 = uVar10 + 0x3f & 0xffffffc0;
      if (uVar13 < extraout_EDX) {
        return 1;
      }
      if (*(long *)pZVar14 == 0) goto LAB_0012b58c;
      size = (ZoneAllocator *)(ulong)(uVar13 >> 3);
      pZVar6 = (ZoneBitVector *)ZoneAllocator::_alloc(pZVar14,(size_t)size,&uStack_90);
      if (pZVar6 == (ZoneBitVector *)0x0) {
        return 1;
      }
      uVar12 = uStack_90 * 8;
      uStack_a8 = uVar8;
      pZStack_a0 = pZVar14;
      if (uVar12 < uStack_90) goto LAB_0012b591;
      goto LAB_0012b38e;
    }
  }
  uVar13 = uVar11 >> 6;
  pZStack_a0 = (ZoneAllocator *)(ulong)uVar13;
  uVar10 = (uint)uVar8;
  sVar3 = (sbyte)(uVar10 & 0x3f);
  lVar9 = -(in_R8 & 0xff);
  uVar11 = uVar11 & 0x3f;
  if (uVar11 != 0) {
    sVar7 = 0;
    if ((uVar13 == ((uint)(uVar8 >> 6) & 0x3ffffff)) && (sVar7 = sVar3, (uVar10 & 0x3f) <= uVar11))
    {
LAB_0012b5a3:
      uVar13 = (uint)size;
      _resize();
      uVar11 = 0xcb;
      if (uVar13 < 0xcb) {
        uVar11 = uVar13;
      }
      EVar4 = String::_opString((String *)pZStack_a0,kAppend,
                                "None" + arm::FormatterInternal::formatFeature::sFeatureIndex
                                         [uVar11],0xffffffffffffffff);
      return EVar4;
    }
    *(ulong *)(pZVar5 + (long)pZStack_a0 * 8) =
         *(ulong *)(pZVar5 + (long)pZStack_a0 * 8) | lVar9 << (sVar7 - (char)uVar11 & 0x3fU);
    uVar13 = uVar13 + 1;
  }
  auVar2 = _DAT_0014dc40;
  auVar1 = _DAT_0014dc30;
  uVar11 = uVar10 + 0x3f >> 6;
  if (uVar13 < uVar11) {
    uVar15 = (ulong)uVar13;
    lVar16 = (uVar11 - uVar15) + -1;
    auVar18._8_4_ = (int)lVar16;
    auVar18._0_8_ = lVar16;
    auVar18._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar12 = 0;
    auVar18 = auVar18 ^ _DAT_0014dc40;
    do {
      auVar19._8_4_ = (int)uVar12;
      auVar19._0_8_ = uVar12;
      auVar19._12_4_ = (int)(uVar12 >> 0x20);
      auVar19 = (auVar19 | auVar1) ^ auVar2;
      if ((bool)(~(auVar19._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar19._0_4_ ||
                  auVar18._4_4_ < auVar19._4_4_) & 1)) {
        *(long *)(pZVar5 + uVar12 * 8 + uVar15 * 8) = lVar9;
      }
      if ((auVar19._12_4_ != auVar18._12_4_ || auVar19._8_4_ <= auVar18._8_4_) &&
          auVar19._12_4_ <= auVar18._12_4_) {
        *(long *)(pZVar5 + uVar12 * 8 + uVar15 * 8 + 8) = lVar9;
      }
      uVar12 = uVar12 + 2;
    } while (((uVar11 - uVar15) + 1 & 0xfffffffffffffffe) != uVar12);
  }
  if ((uVar8 & 0x3f) != 0) {
    uVar8 = 0;
    if ((char)in_R8 != '\0') {
      uVar8 = ~(-1L << sVar3);
    }
    *(ulong *)(pZVar5 + (ulong)(uVar11 - 1) * 8) = uVar8;
  }
  *(uint *)size = uVar10;
  return 0;
}

Assistant:

Error ZoneBitVector::copyFrom(ZoneAllocator* allocator, const ZoneBitVector& other) noexcept {
  BitWord* data = _data;
  uint32_t newSize = other.size();

  if (!newSize) {
    _size = 0;
    return kErrorOk;
  }

  if (newSize > _capacity) {
    // Realloc needed... Calculate the minimum capacity (in bytes) required.
    uint32_t minimumCapacityInBits = Support::alignUp<uint32_t>(newSize, kBitWordSizeInBits);
    if (ASMJIT_UNLIKELY(minimumCapacityInBits < newSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    // Normalize to bytes.
    uint32_t minimumCapacity = minimumCapacityInBits / 8;
    size_t allocatedCapacity;

    BitWord* newData = static_cast<BitWord*>(allocator->alloc(minimumCapacity, allocatedCapacity));
    if (ASMJIT_UNLIKELY(!newData))
      return DebugUtils::errored(kErrorOutOfMemory);

    // `allocatedCapacity` now contains number in bytes, we need bits.
    size_t allocatedCapacityInBits = allocatedCapacity * 8;

    // Arithmetic overflow should normally not happen. If it happens we just
    // change the `allocatedCapacityInBits` to the `minimumCapacityInBits` as
    // this value is still safe to be used to call `_allocator->release(...)`.
    if (ASMJIT_UNLIKELY(allocatedCapacityInBits < allocatedCapacity))
      allocatedCapacityInBits = minimumCapacityInBits;

    if (data)
      allocator->release(data, _capacity / 8);
    data = newData;

    _data = data;
    _capacity = uint32_t(allocatedCapacityInBits);
  }

  _size = newSize;
  _copyBits(data, other.data(), _wordsPerBits(newSize));

  return kErrorOk;
}